

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::ExpressionsAssignment3<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsAssignment3<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  int iVar1;
  int sub_script_index;
  int iVar2;
  allocator<char> local_e2;
  allocator<char> local_e1;
  ExpressionsAssignment3<glcts::ArraysOfArrays::Interface::GL> *local_e0;
  ulong local_d8;
  string prefix;
  string local_b0 [32];
  string local_90 [32];
  string shader_source;
  string base_variable_string;
  
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  prefix._M_string_length = 0;
  prefix.field_2._M_local_buf[0] = '\0';
  base_variable_string._M_dataplus._M_p = (pointer)&base_variable_string.field_2;
  base_variable_string._M_string_length = 0;
  base_variable_string.field_2._M_local_buf[0] = '\0';
  local_e0 = this;
  std::__cxx11::string::string<std::allocator<char>>(local_90,"    float a",&local_e1);
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"[1]",&local_e2);
  (*(local_e0->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
    super_TestNode._vptr_TestNode[6])(&shader_source,local_e0,local_90,local_b0,4);
  std::__cxx11::string::operator=((string *)&prefix,(string *)&shader_source);
  std::__cxx11::string::~string((string *)&shader_source);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::append((char *)&prefix);
  std::__cxx11::string::append((char *)&prefix);
  iVar1 = 0;
  local_d8 = (ulong)tested_shader_type;
  while( true ) {
    if (iVar1 == 0x10) {
      std::__cxx11::string::~string((string *)&base_variable_string);
      std::__cxx11::string::~string((string *)&prefix);
      return;
    }
    std::__cxx11::string::_M_assign((string *)&base_variable_string);
    for (iVar2 = 3; -1 < iVar2; iVar2 = iVar2 + -1) {
      std::__cxx11::string::append((char *)&base_variable_string);
    }
    std::__cxx11::string::append((char *)&base_variable_string);
    if (iVar1 != 0xf) break;
    iVar1 = 0x10;
  }
  std::operator+(&shader_source,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 shader_start_abi_cxx11_,&base_variable_string);
  std::__cxx11::string::append((char *)&shader_source);
  if (tested_shader_type < SHADER_TYPE_LAST) {
    (*(code *)(&DAT_01722b04 + *(int *)(&DAT_01722b04 + local_d8 * 4)))();
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Unrecognized shader type.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0xb29);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ExpressionsAssignment3<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string prefix, base_variable_string;

	const int test_array_dimensions = 4;

	prefix = this->extend_string("    float a", "[1]", 4);
	prefix += " = float[][][][](\n"
			  "       float[][][](\n"
			  "           float[][](\n"
			  "               float[](1.0))));\n";

	prefix += "    float b";

	for (int permutation = 0; permutation < (1 << test_array_dimensions); permutation++)
	{
		base_variable_string = prefix;

		for (int sub_script_index = test_array_dimensions - 1; sub_script_index >= 0; sub_script_index--)
		{
			if (permutation & (1 << sub_script_index))
			{
				base_variable_string += "[1]";
			}
			else
			{
				base_variable_string += "[2]";
			}
		}

		base_variable_string += ";\n\n";

		if (permutation != (1 << test_array_dimensions) - 1)
		{
			std::string shader_source = shader_start + base_variable_string;

			shader_source += "    b = a;\n";

			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			this->execute_negative_test(tested_shader_type, shader_source);
		} /* if (permutation != (1 << test_array_dimensions) - 1) */
	}	 /* for (int permutation = 0; ...) */
}